

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

void phosg::print_color_escape(FILE *stream,TerminalFormat color,...)

{
  char *__ptr;
  size_type __size;
  __va_list_tag *in_RCX;
  undefined1 local_58 [8];
  string fmt;
  va_list va;
  TerminalFormat color_local;
  FILE *stream_local;
  
  fmt.field_2._12_4_ = 0x30;
  fmt.field_2._8_4_ = 0x10;
  vformat_color_escape_abi_cxx11_
            ((string *)local_58,(phosg *)(ulong)(uint)color,(int)&fmt + 0x18,in_RCX);
  __ptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  __size = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                     ((string *)local_58);
  fwrite(__ptr,__size,1,(FILE *)stream);
  ::std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void print_color_escape(FILE* stream, TerminalFormat color, ...) {
  va_list va;
  va_start(va, color);
  string fmt = vformat_color_escape(color, va);
  va_end(va);
  fwrite(fmt.data(), fmt.size(), 1, stream);
}